

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O3

int zueci_dest_len_utf8(int eci,uchar *src,int src_len,uint replacement_char,uint flags,
                       int *p_dest_len)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong extraout_RDX;
  byte *pbVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  zueci_u32 len;
  byte *pbVar11;
  zueci_u32 u;
  uchar replacement [5];
  int local_5c;
  uint local_58;
  uint local_54;
  ulong local_50;
  zueci_utf8_func_t local_48;
  int *local_40;
  uchar local_35 [5];
  
  uVar6 = (ulong)(uint)src_len;
  local_50 = (ulong)replacement_char;
  if ((uint)eci < 0x24) {
    if (eci == 0xe) {
      return 7;
    }
    if (eci == 0x13) {
      return 7;
    }
  }
  else if ((eci != 899) && (eci != 0xaa)) {
    return 7;
  }
  if (p_dest_len == (int *)0x0 || src == (uchar *)0x0) {
    return 8;
  }
  pbVar7 = src + src_len;
  local_40 = p_dest_len;
  if ((eci == 899) ||
     (((flags & 1) != 0 &&
      ((((uint)eci < 0x1c && ((0x800000aU >> (eci & 0x1fU) & 1) != 0)) || (eci == 0xaa)))))) {
    if (0 < src_len) {
      iVar8 = 0;
      iVar10 = 0;
      do {
        bVar2 = *src;
        src = src + 1;
        iVar10 = iVar10 + (uint)(bVar2 >> 7) + 1;
      } while (src < pbVar7);
      goto LAB_0018fd12;
    }
  }
  else {
    if (replacement_char == 0) {
      local_5c = 0;
      iVar4 = 0;
    }
    else {
      if (0xd7ff < replacement_char && replacement_char - 0x10000 < 0xffffe000) {
        return 8;
      }
      local_5c = zueci_encode_utf8(replacement_char,local_35);
      iVar4 = (int)local_50;
      uVar6 = extraout_RDX;
    }
    if ((eci & 0x3bdU) == 1) {
      if (0 < src_len) {
        iVar8 = 0;
        iVar10 = 0;
        do {
          if ((char)*src < -0x60) {
            iVar8 = 1;
            iVar3 = local_5c;
            if (iVar4 == 0) {
              return 6;
            }
          }
          else {
            iVar3 = (*src >> 7) + 1;
          }
          iVar10 = iVar10 + iVar3;
          src = src + 1;
        } while (src < pbVar7);
        goto LAB_0018fd12;
      }
    }
    else {
      if (eci == 0xaa) {
        local_48 = zueci_ascii_inv_u;
      }
      else {
        if (eci == 0x1a) {
          if (0 < src_len) {
            iVar8 = 0;
            iVar10 = 0;
            do {
              uVar9 = 0;
              do {
                pbVar11 = src;
                bVar2 = *pbVar11;
                if ((int)uVar9 == 0) {
                  uVar5 = 0xffU >> (zueci_decode_utf8_utf8d[bVar2] & 0x1f) & (uint)bVar2;
                }
                else {
                  uVar5 = (int)uVar6 << 6 | bVar2 & 0x3f;
                }
                uVar6 = (ulong)uVar5;
                pbVar1 = pbVar11 + 1;
                bVar2 = zueci_decode_utf8_utf8d
                        [(byte)zueci_decode_utf8_utf8d[bVar2] + uVar9 + 0x100];
                uVar9 = (ulong)bVar2;
                if (pbVar7 <= pbVar1) {
                  if (bVar2 == 0) {
LAB_0018fc36:
                    src = pbVar11 + 1;
                    iVar3 = (((uint)(0x7f < uVar5) - (uint)(uVar5 < 0x800)) -
                            (uint)(uVar5 < 0x10000)) + 3;
                    goto LAB_0018fc61;
                  }
                  break;
                }
                if (bVar2 == 0) goto LAB_0018fc36;
                src = pbVar1;
              } while (bVar2 != 0xc);
              if (iVar4 == 0) {
                return 9;
              }
              src = pbVar11;
              if ((char)*pbVar11 < '\0') {
                src = pbVar11 + 1;
              }
              iVar8 = 1;
              iVar3 = local_5c;
              if ((char)*pbVar11 < '\0' && pbVar7 > pbVar1) {
                src = pbVar11 + 1;
              }
LAB_0018fc61:
              iVar10 = iVar10 + iVar3;
            } while (src < pbVar7);
            goto LAB_0018fd12;
          }
          goto LAB_0018fd0d;
        }
        local_48 = zueci_utf8_funcs[(uint)eci];
      }
      if (0 < src_len) {
        iVar8 = 0;
        iVar10 = 0;
        local_54 = flags;
        do {
          len = (int)pbVar7 - (int)src;
          iVar4 = (*local_48)(src,len,local_54,&local_58);
          if (iVar4 == 0) {
            if ((int)local_50 == 0) {
              return 6;
            }
            iVar4 = zueci_replacement_incr(eci,src,len);
            iVar8 = 1;
            iVar3 = local_5c;
          }
          else {
            iVar3 = (((uint)(0x7f < local_58) - (uint)(local_58 < 0x800)) -
                    (uint)(local_58 < 0x10000)) + 3;
          }
          iVar10 = iVar10 + iVar3;
          src = src + iVar4;
        } while (src < pbVar7);
        goto LAB_0018fd12;
      }
    }
  }
LAB_0018fd0d:
  iVar10 = 0;
  iVar8 = 0;
LAB_0018fd12:
  *local_40 = iVar10;
  return iVar8;
}

Assistant:

ZUECI_EXTERN int zueci_dest_len_utf8(const int eci, const unsigned char src[], const int src_len,
                const unsigned int replacement_char, const int unsigned flags, int *p_dest_len) {
    const unsigned char *s = src;
    const unsigned char *const se = src + src_len;
    zueci_utf8_func_t utf8_func;
    zueci_u32 u;
    int src_incr;
    unsigned char replacement[5];
    int replacement_len = 0; /* g++ complains with "-Wmaybe-uninitialized" if this isn't set */
    int dest_len = 0;
    int ret = 0;

    /* NOTE: the following is "unrolled" from `zueci_eci_to_utf8()` and should be the same except for the copying */

    if (!zueci_is_valid_eci(eci)) {
        return ZUECI_ERROR_INVALID_ECI;
    }
    if (!src || !p_dest_len) {
        return ZUECI_ERROR_INVALID_ARGS;
    }

    /* Special case Binary, and if straight-thru flag set then ISO/IEC 8859-1, ASCII and ISO/IEC 646 Invariant also */
    if (eci == 899 || ((flags & ZUECI_FLAG_SB_STRAIGHT_THRU) && (eci == 1 || eci == 3 || eci == 27 || eci == 170))) {
        while (s < se) {
            dest_len += 1 + (*s++ >= 0x80);
        }
        *p_dest_len = dest_len;
        return 0;
    }

    if (replacement_char) {
        if (!ZUECI_IS_VALID_UNICODE(replacement_char) || replacement_char > 0xFFFF) { /* Allow BMP only */
            return ZUECI_ERROR_INVALID_ARGS;
        }
        replacement_len = zueci_encode_utf8(replacement_char, replacement);
    }

    /* Special case ISO/IEC 8859-1 */
    if (eci == 1 || eci == 3) {
        for (; s < se; s++) {
            if (*s >= 0x80 && *s < 0xA0) {
                if (!replacement_char) {
                    return ZUECI_ERROR_INVALID_DATA;
                }
                dest_len += replacement_len;
                ret = ZUECI_WARN_INVALID_DATA;
            } else {
                dest_len += 1 + (*s >= 0x80);
            }
        }
        *p_dest_len = dest_len;
        return ret;
    }

    /* Special case UTF-8 */
    if (eci == 26) {
        unsigned int state = 0;
        while (s < se) {
            do {
                zueci_decode_utf8(&state, &u, *s++);
            } while (s < se && state != 0 && state != 12);
            if (state != 0) {
                if (!replacement_char) {
                    return ZUECI_ERROR_INVALID_UTF8;
                }
                if (*(s - 1) < 0x80) { /* If previous ASCII, backtrack */
                    s--;
                } else {
                    while (s < se && (*s & 0xC0) == 0x80) { /* Skip any continuation bytes */
                        s++;
                    }
                }
                dest_len += replacement_len;
                ret = ZUECI_WARN_INVALID_DATA;
                state = 0;
            } else {
                dest_len += 1 + (u >= 0x80) + (u >= 0x800) + (u >= 0x10000);
            }
        }
        *p_dest_len = dest_len;
        return ret;
    }

    if (eci == 170) {
        utf8_func = zueci_ascii_inv_u;
    } else {
        utf8_func = zueci_utf8_funcs[eci];
    }

    while (s < se) {
        if (!(src_incr = (*utf8_func)(s, (int) (se - s), flags, &u))) {
            if (!replacement_char) {
                return ZUECI_ERROR_INVALID_DATA;
            }
            s += zueci_replacement_incr(eci, s, (int) (se - s));
            dest_len += replacement_len;
            ret = ZUECI_WARN_INVALID_DATA;
        } else {
            s += src_incr;
            dest_len += 1 + (u >= 0x80) + (u >= 0x800) + (u >= 0x10000);
        }
    }
    *p_dest_len = dest_len;
    return ret;
}